

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhileCommand.cpp
# Opt level: O2

void __thiscall WhileCommand::doCommand(WhileCommand *this)

{
  string *this_00;
  bool bVar1;
  unsigned_long uVar2;
  reference pvVar3;
  ConditionParser *pCVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  mapped_type *ppCVar8;
  int iVar9;
  int iVar10;
  key_type *__k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  __node_base_ptr __n;
  bool bVar12;
  undefined1 local_120 [8];
  string left;
  string oper;
  string right;
  string currentComStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separetedCopy;
  undefined1 local_78 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
  stringsToCommands;
  ConditionParser *local_38;
  ConditionParser *conditionParser;
  
  uVar2 = DataCommands::getIndex(this->dataCommands);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,this->dataCommands);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78,uVar2 + 1);
  std::__cxx11::string::string((string *)local_120,(string *)pvVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,this->dataCommands);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78,uVar2 + 2);
  std::__cxx11::string::string((string *)(left.field_2._M_local_buf + 8),(string *)pvVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,this->dataCommands);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78,uVar2 + 3);
  std::__cxx11::string::string((string *)(oper.field_2._M_local_buf + 8),(string *)pvVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  pCVar4 = (ConditionParser *)operator_new(0x38);
  ConditionParser::ConditionParser
            (pCVar4,(string *)local_120,(string *)((long)&left.field_2 + 8),
             (string *)((long)&oper.field_2 + 8),this->dataVars);
  local_38 = pCVar4;
  std::vector<ConditionParser_*,_std::allocator<ConditionParser_*>_>::push_back
            (&this->deathMap,&local_38);
  DataCommands::getStringsToCommands_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
              *)local_78,this->dataCommands);
  __n = (__node_base_ptr)(uVar2 + 4);
  bVar12 = false;
  lVar5 = (long)__n * 0x20;
  this_00 = (string *)(&right.field_2._M_allocated_capacity + 1);
  stringsToCommands._M_h._M_single_bucket = __n;
  while( true ) {
    bVar1 = ConditionParser::checkCondition(local_38);
    if (!bVar1) break;
    DataCommands::setIndex
              (this->dataCommands,(unsigned_long)stringsToCommands._M_h._M_single_bucket);
    DataCommands::getSeparated_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&currentComStr.field_2 + 8),this->dataCommands);
    __k = (key_type *)(currentComStr.field_2._8_8_ + lVar5);
    iVar9 = 0;
    __n = stringsToCommands._M_h._M_single_bucket;
    do {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&currentComStr.field_2 + 8),(size_type)__n);
      std::__cxx11::string::string(this_00,(string *)pvVar3);
      lVar6 = std::__cxx11::string::find((char)this_00,0x7b);
      if (lVar6 == -1) {
        lVar6 = std::__cxx11::string::find((char)this_00,0x7d);
        if (lVar6 == -1) {
          sVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_78,__k);
          if (sVar7 == 0) {
            __k = __k + 1;
          }
          else {
            ppCVar8 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)local_78,__k);
            (**(*ppCVar8)->_vptr_Command)();
            __n = (__node_base_ptr)DataCommands::getIndex(this->dataCommands);
            __k = (key_type *)((long)__n * 0x20 + currentComStr.field_2._8_8_);
          }
        }
        else {
          __n = (__node_base_ptr)((long)&__n->_M_nxt + 1);
          DataCommands::setIndex(this->dataCommands,(unsigned_long)__n);
          iVar9 = iVar9 + -1;
        }
      }
      else {
        __n = (__node_base_ptr)((long)&__n->_M_nxt + 1);
        DataCommands::setIndex(this->dataCommands,(unsigned_long)__n);
        __k = __k + 1;
        iVar9 = iVar9 + 1;
      }
      std::__cxx11::string::~string(this_00);
    } while (iVar9 != 0);
    pCVar4 = (ConditionParser *)operator_new(0x38);
    ConditionParser::ConditionParser
              (pCVar4,(string *)local_120,(string *)((long)&left.field_2 + 8),
               (string *)((long)&oper.field_2 + 8),this->dataVars);
    local_38 = pCVar4;
    std::vector<ConditionParser_*,_std::allocator<ConditionParser_*>_>::push_back
              (&this->deathMap,&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&currentComStr.field_2 + 8));
    bVar12 = true;
  }
  if (!bVar12) {
    iVar9 = 0;
    do {
      pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&right.field_2._M_allocated_capacity + 1);
      DataCommands::getSeparated_abi_cxx11_(pvVar11,this->dataCommands);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(pvVar11,(size_type)__n);
      lVar5 = std::__cxx11::string::find((char)pvVar3,0x7b);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(pvVar11);
      iVar10 = 1;
      if (lVar5 == -1) {
        pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(&right.field_2._M_allocated_capacity + 1);
        DataCommands::getSeparated_abi_cxx11_(pvVar11,this->dataCommands);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(pvVar11,(size_type)__n);
        lVar5 = std::__cxx11::string::find((char)pvVar3,0x7d);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(pvVar11);
        iVar10 = -(uint)(lVar5 != -1);
      }
      __n = (__node_base_ptr)((long)&__n->_M_nxt + 1);
      bVar12 = SCARRY4(iVar9,iVar10);
      iVar9 = iVar9 + iVar10;
    } while (iVar9 != 0 && bVar12 == iVar9 < 0);
  }
  DataCommands::setIndex(this->dataCommands,(unsigned_long)__n);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_78);
  std::__cxx11::string::~string((string *)(oper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(left.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_120);
  return;
}

Assistant:

void WhileCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;

    // get the left from the vector in dataCommands
    string left = this->dataCommands->getSeparated().at(index);
    // skip the left
    index++;

    // get the operator from the vector in dataCommands
    string oper = this->dataCommands->getSeparated().at(index);
    // skip the oper
    index++;

    // get the right from the vector in dataCommands
    string right = this->dataCommands->getSeparated().at(index);
    // skip the right
    index++;

    ConditionParser *conditionParser;
    conditionParser = new ConditionParser(left, oper, right, this->dataVars);
    this->deathMap.push_back(conditionParser);
    unordered_map<string, Command *> stringsToCommands = dataCommands->getStringsToCommands();
    unsigned long oldIndex = index;
    bool isEntered = false;
    while (conditionParser->checkCondition()) {
        isEntered = true;
        index = oldIndex;
        // set the new index of dataCommands
        this->dataCommands->setIndex(oldIndex);
        vector<string> separetedCopy=this->dataCommands->getSeparated();
        auto it1 = separetedCopy.begin();
        it1 += index;
        Command *command;
        int bracesCounter = 0;
        do {
            string currentComStr=separetedCopy.at(index);
            if (currentComStr.find('{') != string::npos) {
                bracesCounter++;
                index++;
                it1++;
                // set the new index of dataCommands
                this->dataCommands->setIndex(index);
                continue;
            } else if (currentComStr.find('}') != string::npos) {
                bracesCounter--;
                index++;
                // set the new index of dataCommands
                this->dataCommands->setIndex(index);
                continue;
            }
            if(stringsToCommands.count(*it1)>=1) {
                command = stringsToCommands.at(*it1);
                command->doCommand();
            }
            else{
                it1++;
                continue;
            }

            index = this->dataCommands->getIndex();
            it1 = separetedCopy.begin();
            it1 += index;

        } while (bracesCounter != 0);
        conditionParser = new ConditionParser(left, oper, right, this->dataVars);
        this->deathMap.push_back(conditionParser);
    }
    if (!isEntered) {
        //right now at '{'. index++ until we get to the last '}'
        int bracesSkipCount = 0;
        do{
            if (this->dataCommands->getSeparated().at(index).find('{') != string::npos) {
                bracesSkipCount++;
            }else if (this->dataCommands->getSeparated().at(index).find('}') != string::npos) {
                bracesSkipCount--;
            }
            index++;
        }while (bracesSkipCount > 0);
    }

    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}